

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O0

void __thiscall AddrManImpl::ResolveCollisions_(AddrManImpl *this)

{
  bool bVar1;
  strong_ordering sVar2;
  size_type sVar3;
  mapped_type *this_00;
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> tVar4;
  CService *in_RDI;
  long in_FS_OFFSET;
  AddrInfo *info_old;
  int tried_bucket_pos;
  int tried_bucket;
  AddrInfo *info_new;
  bool erase_collision;
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> current_time;
  nid_type id_old;
  nid_type id_new;
  iterator it;
  undefined4 in_stack_fffffffffffffe08;
  int in_stack_fffffffffffffe0c;
  char *in_stack_fffffffffffffe10;
  unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
  *in_stack_fffffffffffffe18;
  int iVar5;
  const_iterator in_stack_fffffffffffffe20;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe28;
  _Self in_stack_fffffffffffffe58;
  time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> in_stack_fffffffffffffe60
  ;
  AddrInfo *in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  int in_stack_fffffffffffffe7c;
  int in_stack_fffffffffffffe8c;
  mapped_type *in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffe9c;
  undefined7 in_stack_fffffffffffffea8;
  byte bVar6;
  duration in_stack_fffffffffffffeb8;
  string_view in_stack_fffffffffffffec0;
  string_view in_stack_fffffffffffffed0;
  NodeSeconds in_stack_ffffffffffffff38;
  _Rb_tree_node_base local_88;
  Level in_stack_ffffffffffffffb0;
  _Base_ptr in_stack_ffffffffffffffc0;
  _Base_ptr in_stack_ffffffffffffffc8;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  AssertLockHeldInternal<AnnotatedMixin<std::mutex>>
            ((char *)in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c,
             (AnnotatedMixin<std::mutex> *)0xee7749);
  std::set<long,_std::less<long>,_std::allocator<long>_>::begin
            ((set<long,_std::less<long>,_std::allocator<long>_> *)in_stack_fffffffffffffe10);
  while( true ) {
    std::set<long,_std::less<long>,_std::allocator<long>_>::end
              ((set<long,_std::less<long>,_std::allocator<long>_> *)in_stack_fffffffffffffe10);
    bVar1 = std::operator==((_Self *)in_stack_fffffffffffffe18,(_Self *)in_stack_fffffffffffffe10);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    std::_Rb_tree_const_iterator<long>::operator*
              ((_Rb_tree_const_iterator<long> *)
               CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
    bVar6 = 0;
    sVar3 = std::
            unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
            ::count(in_stack_fffffffffffffe18,(key_type *)in_stack_fffffffffffffe10);
    if (sVar3 == 1) {
      this_00 = std::
                unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
                ::operator[](in_stack_fffffffffffffe18,(key_type *)in_stack_fffffffffffffe10);
      in_stack_fffffffffffffe9c =
           AddrInfo::GetTriedBucket
                     (this_00,(uint256 *)
                              CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                      (NetGroupManager *)in_stack_fffffffffffffe90);
      in_stack_fffffffffffffe98 =
           AddrInfo::GetBucketPosition
                     (in_stack_fffffffffffffe68,(uint256 *)in_stack_fffffffffffffe60.__d.__r,
                      SUB81((ulong)in_stack_fffffffffffffe58._M_node >> 0x38,0),
                      in_stack_fffffffffffffe8c);
      bVar1 = CNetAddr::IsValid((CNetAddr *)in_stack_fffffffffffffe20._M_node);
      if (bVar1) {
        if (*(long *)((long)in_RDI +
                     (long)in_stack_fffffffffffffe98 * 8 +
                     (long)in_stack_fffffffffffffe9c * 0x200 + 0x178) == -1) {
          in_stack_fffffffffffffe60 =
               Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>
                         ();
          Good_((AddrManImpl *)CONCAT17(bVar6,in_stack_fffffffffffffea8),(CService *)this_00,
                SUB41((uint)in_stack_fffffffffffffe9c >> 0x18,0),in_stack_ffffffffffffff38);
          bVar6 = 1;
        }
        else {
          in_stack_fffffffffffffe90 =
               std::
               unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
               ::operator[](in_stack_fffffffffffffe18,(key_type *)in_stack_fffffffffffffe10);
          tVar4 = Now<std::chrono::time_point<NodeClock,std::chrono::duration<long,std::ratio<1l,1l>>>>
                            ();
          std::chrono::operator-
                    ((time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
                     in_stack_fffffffffffffe10,
                     (time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *)
                     CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
          sVar2 = std::chrono::operator<=><long,_std::ratio<1L,_1L>,_long,_std::ratio<3600L,_1L>_>
                            ((duration<long,_std::ratio<1L,_1L>_> *)
                             in_stack_fffffffffffffe20._M_node,
                             (duration<long,_std::ratio<3600L,_1L>_> *)in_stack_fffffffffffffe18);
          in_stack_fffffffffffffe8c = CONCAT13(sVar2._M_value,(int3)in_stack_fffffffffffffe8c);
          std::__cmp_cat::__unspec::__unspec
                    ((__unspec *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                     (__unspec *)0xee7950);
          bVar1 = std::operator<((char)((uint)in_stack_fffffffffffffe8c >> 0x18));
          if (bVar1) {
            bVar6 = 1;
          }
          else {
            in_stack_ffffffffffffff38.__d.__r =
                 std::chrono::operator-
                           ((time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
                             *)in_stack_fffffffffffffe10,
                            (time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
                             *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
            sVar2 = std::chrono::operator<=><long,_std::ratio<1L,_1L>,_long,_std::ratio<3600L,_1L>_>
                              ((duration<long,_std::ratio<1L,_1L>_> *)
                               in_stack_fffffffffffffe20._M_node,
                               (duration<long,_std::ratio<3600L,_1L>_> *)in_stack_fffffffffffffe18);
            in_stack_fffffffffffffe8c =
                 CONCAT13((char)((uint)in_stack_fffffffffffffe8c >> 0x18),
                          CONCAT12(sVar2._M_value,(short)in_stack_fffffffffffffe8c));
            std::__cmp_cat::__unspec::__unspec
                      ((__unspec *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                       (__unspec *)0xee79bd);
            bVar1 = std::operator<((char)((uint)in_stack_fffffffffffffe8c >> 0x10));
            if (bVar1) {
              std::chrono::operator-
                        ((time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *
                         )in_stack_fffffffffffffe10,
                         (time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *
                         )CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
              s<(char)54,(char)48>();
              sVar2 = std::chrono::operator<=><long,_std::ratio<1L,_1L>,_long,_std::ratio<1L,_1L>_>
                                ((duration<long,_std::ratio<1L,_1L>_> *)
                                 in_stack_fffffffffffffe20._M_node,
                                 (duration<long,_std::ratio<1L,_1L>_> *)in_stack_fffffffffffffe18);
              in_stack_fffffffffffffe8c =
                   CONCAT22((short)((uint)in_stack_fffffffffffffe8c >> 0x10),
                            CONCAT11(sVar2._M_value,(char)in_stack_fffffffffffffe8c));
              std::__cmp_cat::__unspec::__unspec
                        ((__unspec *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                         (__unspec *)0xee7a2e);
              bVar1 = std::operator>((char)((uint)in_stack_fffffffffffffe8c >> 8));
              if (bVar1) {
                bVar1 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffe0c,
                                                     in_stack_fffffffffffffe08),Trace);
                if (bVar1) {
                  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                            (in_stack_fffffffffffffe28,(char *)in_stack_fffffffffffffe20._M_node);
                  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                            (in_stack_fffffffffffffe28,(char *)in_stack_fffffffffffffe20._M_node);
                  CService::ToStringAddrPort_abi_cxx11_(in_RDI);
                  CService::ToStringAddrPort_abi_cxx11_(in_RDI);
                  in_stack_fffffffffffffe20._M_node = (_Base_ptr)&stack0xffffffffffffffb8;
                  in_stack_fffffffffffffe18 =
                       (unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
                        *)&stack0xffffffffffffffd8;
                  in_stack_fffffffffffffe10 = "Replacing %s with %s in tried table\n";
                  in_stack_fffffffffffffe08 = 1;
                  LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
                            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec0,
                             in_stack_fffffffffffffe7c,
                             CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                             in_stack_ffffffffffffffb0,
                             (ConstevalFormatString<2U>)in_stack_fffffffffffffeb8.__r,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_ffffffffffffffc0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_ffffffffffffffc8);
                  std::__cxx11::string::~string
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
                  std::__cxx11::string::~string
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
                }
                Good_((AddrManImpl *)CONCAT17(bVar6,in_stack_fffffffffffffea8),(CService *)this_00,
                      SUB41((uint)in_stack_fffffffffffffe9c >> 0x18,0),in_stack_ffffffffffffff38);
                bVar6 = 1;
              }
            }
            else {
              std::chrono::operator-
                        ((time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *
                         )in_stack_fffffffffffffe10,
                         (time_point<NodeClock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *
                         )CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
              sVar2 = std::chrono::operator<=><long,_std::ratio<1L,_1L>,_long,_std::ratio<60L,_1L>_>
                                ((duration<long,_std::ratio<1L,_1L>_> *)
                                 in_stack_fffffffffffffe20._M_node,
                                 (duration<long,_std::ratio<60L,_1L>_> *)in_stack_fffffffffffffe18);
              in_stack_fffffffffffffe70 = CONCAT13(sVar2._M_value,(int3)in_stack_fffffffffffffe70);
              std::__cmp_cat::__unspec::__unspec
                        ((__unspec *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                         (__unspec *)0xee7c01);
              bVar1 = std::operator>((char)((uint)in_stack_fffffffffffffe70 >> 0x18));
              if (bVar1) {
                bVar1 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffe0c,
                                                     in_stack_fffffffffffffe08),Trace);
                if (bVar1) {
                  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                            (in_stack_fffffffffffffe28,(char *)in_stack_fffffffffffffe20._M_node);
                  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                            (in_stack_fffffffffffffe28,(char *)in_stack_fffffffffffffe20._M_node);
                  in_stack_fffffffffffffe10 =
                       "Unable to test; replacing %s with %s in tried table anyway\n";
                  CService::ToStringAddrPort_abi_cxx11_(in_RDI);
                  CService::ToStringAddrPort_abi_cxx11_(in_RDI);
                  in_stack_fffffffffffffe20._M_node = &local_88;
                  in_stack_fffffffffffffe18 =
                       (unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
                        *)&stack0xffffffffffffff98;
                  in_stack_fffffffffffffe08 = 1;
                  in_stack_fffffffffffffe68 = (AddrInfo *)in_stack_fffffffffffffe10;
                  LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
                            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec0,
                             in_stack_fffffffffffffe7c,
                             CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                             in_stack_ffffffffffffffb0,
                             (ConstevalFormatString<2U>)in_stack_fffffffffffffeb8.__r,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_ffffffffffffffc0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_ffffffffffffffc8);
                  std::__cxx11::string::~string
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
                  std::__cxx11::string::~string
                            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
                }
                Good_((AddrManImpl *)CONCAT17(bVar6,in_stack_fffffffffffffea8),(CService *)this_00,
                      SUB41((uint)in_stack_fffffffffffffe9c >> 0x18,0),in_stack_ffffffffffffff38);
                bVar6 = 1;
                in_stack_fffffffffffffeb8 = tVar4.__d.__r;
              }
            }
          }
        }
      }
      else {
        bVar6 = 1;
      }
    }
    else {
      bVar6 = 1;
    }
    iVar5 = (int)((ulong)in_stack_fffffffffffffe18 >> 0x20);
    if ((bVar6 & 1) == 0) {
      std::_Rb_tree_const_iterator<long>::operator++
                ((_Rb_tree_const_iterator<long> *)in_stack_fffffffffffffe20._M_node,iVar5);
    }
    else {
      in_stack_fffffffffffffe58 =
           std::_Rb_tree_const_iterator<long>::operator++(in_stack_fffffffffffffe20._M_node,iVar5);
      std::set<long,std::less<long>,std::allocator<long>>::erase_abi_cxx11_
                ((set<long,_std::less<long>,_std::allocator<long>_> *)
                 CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                 in_stack_fffffffffffffe20);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void AddrManImpl::ResolveCollisions_()
{
    AssertLockHeld(cs);

    for (std::set<nid_type>::iterator it = m_tried_collisions.begin(); it != m_tried_collisions.end();) {
        nid_type id_new = *it;

        bool erase_collision = false;

        // If id_new not found in mapInfo remove it from m_tried_collisions
        if (mapInfo.count(id_new) != 1) {
            erase_collision = true;
        } else {
            AddrInfo& info_new = mapInfo[id_new];

            // Which tried bucket to move the entry to.
            int tried_bucket = info_new.GetTriedBucket(nKey, m_netgroupman);
            int tried_bucket_pos = info_new.GetBucketPosition(nKey, false, tried_bucket);
            if (!info_new.IsValid()) { // id_new may no longer map to a valid address
                erase_collision = true;
            } else if (vvTried[tried_bucket][tried_bucket_pos] != -1) { // The position in the tried bucket is not empty

                // Get the to-be-evicted address that is being tested
                nid_type id_old = vvTried[tried_bucket][tried_bucket_pos];
                AddrInfo& info_old = mapInfo[id_old];

                const auto current_time{Now<NodeSeconds>()};

                // Has successfully connected in last X hours
                if (current_time - info_old.m_last_success < ADDRMAN_REPLACEMENT) {
                    erase_collision = true;
                } else if (current_time - info_old.m_last_try < ADDRMAN_REPLACEMENT) { // attempted to connect and failed in last X hours

                    // Give address at least 60 seconds to successfully connect
                    if (current_time - info_old.m_last_try > 60s) {
                        LogDebug(BCLog::ADDRMAN, "Replacing %s with %s in tried table\n", info_old.ToStringAddrPort(), info_new.ToStringAddrPort());

                        // Replaces an existing address already in the tried table with the new address
                        Good_(info_new, false, current_time);
                        erase_collision = true;
                    }
                } else if (current_time - info_new.m_last_success > ADDRMAN_TEST_WINDOW) {
                    // If the collision hasn't resolved in some reasonable amount of time,
                    // just evict the old entry -- we must not be able to
                    // connect to it for some reason.
                    LogDebug(BCLog::ADDRMAN, "Unable to test; replacing %s with %s in tried table anyway\n", info_old.ToStringAddrPort(), info_new.ToStringAddrPort());
                    Good_(info_new, false, current_time);
                    erase_collision = true;
                }
            } else { // Collision is not actually a collision anymore
                Good_(info_new, false, Now<NodeSeconds>());
                erase_collision = true;
            }
        }

        if (erase_collision) {
            m_tried_collisions.erase(it++);
        } else {
            it++;
        }
    }
}